

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# call_graph.cpp
# Opt level: O1

void __thiscall
HawkTracer::client::CallGraph::_add_new_calltree(CallGraph *this,NodeData *node_data)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  element_type *peVar1;
  pointer ppVar2;
  element_type *local_28;
  pointer ppStack_20;
  pointer local_18;
  element_type *peStack_10;
  
  local_18 = (pointer)0x0;
  peStack_10 = (element_type *)0x0;
  _add_new_call((CallGraph *)&local_28,node_data,
                (shared_ptr<HawkTracer::client::CallGraph::TreeNode> *)node_data,
                (vector<std::pair<std::shared_ptr<HawkTracer::client::CallGraph::TreeNode>,_int>,_std::allocator<std::pair<std::shared_ptr<HawkTracer::client::CallGraph::TreeNode>,_int>_>_>
                 *)&local_18);
  ppVar2 = ppStack_20;
  peVar1 = local_28;
  local_28 = (element_type *)0x0;
  ppStack_20 = (pointer)0x0;
  this_00 = (this->_current_call).
            super___shared_ptr<HawkTracer::client::CallGraph::TreeNode,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi;
  (this->_current_call).
  super___shared_ptr<HawkTracer::client::CallGraph::TreeNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       peVar1;
  (this->_current_call).
  super___shared_ptr<HawkTracer::client::CallGraph::TreeNode,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)ppVar2;
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
  }
  if (ppStack_20 != (pointer)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)ppStack_20);
  }
  if (peStack_10 != (element_type *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)peStack_10);
  }
  return;
}

Assistant:

void CallGraph::_add_new_calltree(const NodeData& node_data)
{
    _current_call = _add_new_call(node_data, nullptr, _root_calls);
}